

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssocks.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Config *this;
  _List_node_base *p_Var3;
  EventLoop *this_00;
  DNSResolve *this_01;
  TCPRelay *this_02;
  UDPRelay *this_03;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dns_servers;
  _List_node_base *local_288;
  _List_node_base *local_280;
  _List_node_base local_278;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Config *)operator_new(0x30);
  Config::Config(this,argc,argv);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"is_local","");
  iVar2 = Config::GetInt(this,&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_e8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_e8;
  local_e8._M_impl._M_node._M_size = 0;
  local_288 = &local_278;
  local_e8._M_impl._M_node.super__List_node_base._M_prev =
       local_e8._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"114.114.114.114","");
  p_Var3 = (_List_node_base *)operator_new(0x30);
  p_Var3[1]._M_next = p_Var3 + 2;
  if (local_288 == &local_278) {
    p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_278._M_next._1_7_,local_278._M_next._0_1_)
    ;
    p_Var3[2]._M_prev = local_278._M_prev;
  }
  else {
    p_Var3[1]._M_next = local_288;
    p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_278._M_next._1_7_,local_278._M_next._0_1_)
    ;
  }
  p_Var3[1]._M_prev = local_280;
  local_280 = (_List_node_base *)0x0;
  local_278._M_next._0_1_ = 0;
  local_288 = &local_278;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  local_e8._M_impl._M_node._M_size = local_e8._M_impl._M_node._M_size + 1;
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  this_00 = (EventLoop *)operator_new(0x78);
  EventLoop::EventLoop(this_00);
  this_01 = (DNSResolve *)operator_new(0x218);
  DNSResolve::DNSResolve
            (this_01,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_e8);
  this_02 = (TCPRelay *)operator_new(0x68);
  TCPRelay::TCPRelay(this_02,this,this_01,iVar2 == 1);
  this_03 = (UDPRelay *)operator_new(0x170);
  UDPRelay::UDPRelay(this_03,this,this_01,iVar2 == 1);
  DNSResolve::AddToLoop(this_01,this_00);
  bVar1 = TCPRelay::Init(this_02);
  if ((bVar1) && (bVar1 = UDPRelay::Init(this_03), bVar1)) {
    if (iVar2 == 1) {
      Log::GetInstance();
      Log::FormatTime_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_288,(long)local_280);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [info] ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"listen ",7);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"local_address","");
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
      Config::GetStr(&local_248,this,&local_108,&local_128);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_248._M_dataplus._M_p,local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"local_port","");
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
      Config::GetStr(&local_268,this,&local_148,&local_168);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," forward to ",0xc);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"server_address","");
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      Config::GetStr(&local_70,this,&local_188,&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"server_port","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
      Config::GetStr(&local_90,this,&local_1c8,&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      paVar5 = &local_108.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      _Var4._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
        _Var4._M_p = local_108._M_dataplus._M_p;
      }
    }
    else {
      Log::GetInstance();
      Log::FormatTime_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_288,(long)local_280);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [info] ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"listen ",7);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"server_address","");
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
      Config::GetStr(&local_248,this,&local_1e8,&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_248._M_dataplus._M_p,local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"server_port","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
      Config::GetStr(&local_268,this,&local_228,&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      paVar5 = &local_1e8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      _Var4._M_p = local_1e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
        _Var4._M_p = local_1e8._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar5) {
      operator_delete(_Var4._M_p);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288);
    }
    TCPRelay::AddToLoop(this_02,this_00);
    UDPRelay::AddToLoop(this_03,this_00);
    EventLoop::Run(this_00);
  }
  Log::GetInstance();
  Log::FormatTime_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_288,(long)local_280);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [error] ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"error occurred, exit...\n",0x18);
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (this_02 != (TCPRelay *)0x0) {
    TCPRelay::Close(this_02);
    (*(this_02->super_ISockNotify)._vptr_ISockNotify[1])(this_02);
  }
  if (this_03 != (UDPRelay *)0x0) {
    (*(this_03->super_ISockNotify)._vptr_ISockNotify[1])(this_03);
  }
  if (this_01 != (DNSResolve *)0x0) {
    DNSResolve::Close(this_01);
    (*(this_01->super_ISockNotify)._vptr_ISockNotify[1])(this_01);
  }
  if (this_00 != (EventLoop *)0x0) {
    EventLoop::~EventLoop(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_e8);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef _WIN32
    int err = 0;
    WSADATA wsaData;
    if (0 != (err = WSAStartup(MAKEWORD(2, 2), &wsaData)))
    {
        WSASetLastError(err);
        return 1;
    }
#endif
    //server --server -p 8881 -s 0.0.0.0
    //		   --server --server-port 8881 --server-address 0.0.0.0
    //client --client -p 8881 -l 1081 -s 127.0.0.1 -b 127.0.0.1
    //		   --client --server-port 8881 --server-address 127.0.0.1 --local-port 1081 --local-address 127.0.0.1
    //parse command line
    Config* config = new Config(argc, argv);
    bool is_local = config->GetInt("is_local") == 1;

    list<string> dns_servers;
    dns_servers.push_back("114.114.114.114");
    DNSResolve* dns_resolver = NULL;

    EventLoop* event_loop = NULL;
    TCPRelay* tcp_server = NULL;
    UDPRelay* udp_server = NULL;
    try
    {
        event_loop = new EventLoop();
        dns_resolver = new DNSResolve(dns_servers);
        tcp_server = new TCPRelay(config, dns_resolver, is_local);
        udp_server = new UDPRelay(config, dns_resolver, is_local);
        dns_resolver->AddToLoop(event_loop);
        if (tcp_server->Init() && udp_server->Init())
        {
            if (is_local)
                LOGI << "listen " << config->GetStr("local_address") << ":" << config->GetStr("local_port") <<
                     " forward to " << config->GetStr("server_address") << ":" << config->GetStr("server_port") << "\n";
            else
                LOGI << "listen " << config->GetStr("server_address") << ":" << config->GetStr("server_port") << "\n";
            tcp_server->AddToLoop(event_loop);
            udp_server->AddToLoop(event_loop);
            event_loop->Run();
        }
        LOGE << "error occurred, exit...\n";
    }
    catch (const std::exception&)
    {
        LOGE << "exception occurred, exit...\n";
    }
    if (tcp_server)
    {
        tcp_server->Close();
        delete tcp_server;
        tcp_server = NULL;
    }
    if (udp_server)
    {
        delete udp_server;
        udp_server = NULL;
    }
    if (dns_resolver)
    {
        dns_resolver->Close();
        delete dns_resolver;
        dns_resolver = NULL;
    }
    if (event_loop)
    {
        delete event_loop;
        event_loop = NULL;
    }
    return 0;
}